

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O0

void __thiscall QEvdevMouseHandler::~QEvdevMouseHandler(QEvdevMouseHandler *this)

{
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_001a89e8;
  if (-1 < *(int *)(in_RDI + 0x28)) {
    qt_safe_close((int)((ulong)in_RDI >> 0x20));
  }
  QString::~QString((QString *)0x146b36);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

QEvdevMouseHandler::~QEvdevMouseHandler()
{
    if (m_fd >= 0)
        qt_safe_close(m_fd);
}